

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

string * cmGlobalNinjaGenerator::EncodeIdent
                   (string *__return_storage_ptr__,string *ident,ostream *vars)

{
  pointer pcVar1;
  long lVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  ostream *poVar4;
  long *plVar5;
  size_type *psVar6;
  ostringstream names;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  pcVar1 = (ident->_M_dataplus)._M_p;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<char,bool>>>>
                    (pcVar1,pcVar1 + ident->_M_string_length,IsIdentChar);
  if (_Var3._M_current == (ident->_M_dataplus)._M_p + ident->_M_string_length) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__);
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","$ ");
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","$:");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ident",5);
    EncodeIdent::VarNum = EncodeIdent::VarNum + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(vars,(char *)local_1b8,local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(ident->_M_dataplus)._M_p,ident->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x639407);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar6) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodeIdent(const std::string& ident,
                                                std::ostream& vars)
{
  if (std::find_if(ident.begin(), ident.end(),
                   std::not1(std::ptr_fun(IsIdentChar))) != ident.end()) {
    static unsigned VarNum = 0;
    std::ostringstream names;
    names << "ident" << VarNum++;
    vars << names.str() << " = " << ident << "\n";
    return "$" + names.str();
  }
  std::string result = ident;
  cmSystemTools::ReplaceString(result, " ", "$ ");
  cmSystemTools::ReplaceString(result, ":", "$:");
  return result;
}